

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O2

ssize_t __thiscall
QNetworkAccessBackend::read(QNetworkAccessBackend *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(this + 8) + 0x80) & 1) == 0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    (*(code *)**(undefined8 **)this)(this,CONCAT44(in_register_00000034,__fd));
    uVar1 = QMetaObject::className();
    QMessageLogger::warning
              (local_30,"Backend (%s) is not ZeroCopy and has not implemented read(...)!",uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkAccessBackend::read(char *data, qint64 maxlen)
{
    Q_UNUSED(data);
    Q_UNUSED(maxlen);
    if ((ioFeatures() & IOFeature::ZeroCopy) == 0) {
        qWarning("Backend (%s) is not ZeroCopy and has not implemented read(...)!",
                 metaObject()->className());
    }
    return 0;
}